

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

void lj_ctype_freestate(global_State *g)

{
  uint uVar1;
  CTState *cts;
  CType *pCVar2;
  CTypeID1 *pCVar3;
  ulong uVar4;
  
  cts = (CTState *)(g->ctype_state).ptr64;
  if (cts != (CTState *)0x0) {
    lj_ccallback_mcode_free(cts);
    pCVar2 = cts->tab;
    uVar1 = cts->sizetab;
    (g->gc).total = (g->gc).total + (ulong)uVar1 * -0x18;
    (*g->allocf)(g->allocd,pCVar2,(ulong)uVar1 * 0x18,0);
    pCVar3 = (cts->cb).cbid;
    uVar4 = (ulong)(cts->cb).sizeid;
    (g->gc).total = (g->gc).total + uVar4 * -2;
    (*g->allocf)(g->allocd,pCVar3,uVar4 * 2,0);
    (g->gc).total = (g->gc).total - 0x208;
    (*g->allocf)(g->allocd,cts,0x208,0);
    return;
  }
  return;
}

Assistant:

void lj_ctype_freestate(global_State *g)
{
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    lj_ccallback_mcode_free(cts);
    lj_mem_freevec(g, cts->tab, cts->sizetab, CType);
    lj_mem_freevec(g, cts->cb.cbid, cts->cb.sizeid, CTypeID1);
    lj_mem_freet(g, cts);
  }
}